

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O3

void __thiscall
WavingSketch<8U,_16U,_4U>::WavingSketch
          (WavingSketch<8U,_16U,_4U> *this,int mem,int _HIT,uint32_t _HASH_NUM)

{
  uint uVar1;
  BitSet *pBVar2;
  uchar *puVar3;
  Bucket *__s;
  clock_t cVar4;
  ulong uVar5;
  ulong uVar6;
  
  (this->super_Abstract<4U>).name._M_dataplus._M_p =
       (pointer)&(this->super_Abstract<4U>).name.field_2;
  (this->super_Abstract<4U>).name._M_string_length = 0;
  (this->super_Abstract<4U>).name.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).sep._M_dataplus._M_p = (pointer)&(this->super_Abstract<4U>).sep.field_2
  ;
  (this->super_Abstract<4U>).sep._M_string_length = 0;
  (this->super_Abstract<4U>).sep.field_2._M_local_buf[0] = '\0';
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111ae0;
  this->BUCKET_NUM = (uint32_t)((ulong)(long)mem / 0x60);
  this->HASH_NUM = _HASH_NUM;
  this->LENGTH = mem << 2;
  this->cnt = 0;
  (this->super_Abstract<4U>).HIT = _HIT;
  std::__cxx11::string::_M_replace((ulong)&(this->super_Abstract<4U>).name,0,(char *)0x0,0x10c83e);
  this->record = 0;
  pBVar2 = (BitSet *)operator_new(0x10);
  uVar1 = this->LENGTH;
  pBVar2->LENGTH = uVar1;
  uVar6 = (ulong)(uVar1 >> 3) + 1;
  puVar3 = (uchar *)operator_new__(uVar6);
  pBVar2->bitset = puVar3;
  memset(puVar3,0,uVar6);
  this->bitset = pBVar2;
  uVar1 = this->BUCKET_NUM;
  uVar6 = (ulong)uVar1 * 0x60;
  __s = (Bucket *)operator_new__(uVar6);
  if ((ulong)uVar1 != 0) {
    uVar5 = 0;
    do {
      puVar3 = __s->items[0].str + uVar5;
      *(undefined8 *)puVar3 = 0;
      *(undefined8 *)(puVar3 + 8) = 0;
      *(undefined8 *)(puVar3 + 0x10) = 0;
      *(undefined8 *)(puVar3 + 0x18) = 0;
      uVar5 = uVar5 + 0x60;
    } while (uVar6 != uVar5);
  }
  this->buckets = __s;
  memset(__s,0,uVar6);
  Abstract<4U>::rename(&this->super_Abstract<4U>,(char *)0x8,(char *)0x10);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Abstract<4U>).sep,0,
             (char *)(this->super_Abstract<4U>).sep._M_string_length,0x10c865);
  cVar4 = clock();
  this->seed_choice = (uint32_t)cVar4;
  sleep(1);
  cVar4 = clock();
  this->seed_incast = (uint32_t)cVar4;
  sleep(1);
  cVar4 = clock();
  this->seed_s = (uint32_t)cVar4;
  return;
}

Assistant:

WavingSketch(int mem, int _HIT, uint32_t _HASH_NUM = 3)
		: BUCKET_NUM(mem / sizeof(Bucket)),
		HASH_NUM(_HASH_NUM),
		LENGTH(mem * 8 * 1 / 2),
		cnt(0)
	{
		this->HIT = _HIT;
		this->name = (char*)"WavingSketch";
		record = 0;
		bitset = new BitSet(LENGTH);
		buckets = new Bucket[BUCKET_NUM];
		memset(buckets, 0, BUCKET_NUM * sizeof(Bucket));
		this->rename(int(slot_num), int(counter_num));
		this->sep = "\t";
		seed_choice = std::clock();
		sleep(1);
		seed_incast = std::clock();
		sleep(1);
		seed_s = std::clock();
		// std::printf("seed_choice: %d, seed_incast: %d, seed_s: %d\n",
		// seed_choice, seed_incast, seed_s);
	}